

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupSelectConfigAutoMap(void *pContext,CUIRect View)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  CUI *this;
  CEditorImage **ppCVar4;
  undefined4 extraout_var;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  int i;
  CLayerTiles *pLayer;
  CEditor *pEditor;
  CUIRect Live;
  CUIRect Full;
  CUIRect Label;
  CUIRect Button;
  CUIRect *in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff64;
  CEditor *in_stack_ffffffffffffff68;
  CUIRect *in_stack_ffffffffffffff70;
  CEditor *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  float fVar5;
  float fVar6;
  CEditor *pCVar7;
  int Checked;
  char *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  CEditor *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = in_RDI;
  this = (CUI *)GetSelectedLayer(in_stack_ffffffffffffff78,
                                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  fVar5 = 0.0;
  do {
    fVar6 = fVar5;
    ppCVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lImages,(int)this->m_MouseY);
    iVar3 = (*(*ppCVar4)->m_pAutoMapper->_vptr_IAutoMapper[5])();
    Checked = (int)((ulong)pCVar7 >> 0x20);
    if (iVar3 <= (int)fVar5) {
LAB_002162ca:
      CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         in_stack_ffffffffffffff58,(CUIRect *)0x2162e6);
      CUIRect::VSplitMid((CUIRect *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         (CUIRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      UI(in_RDI);
      CUI::DoLabel(this,(CUIRect *)CONCAT44(fVar6,fVar5),
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (float)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                   (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
      CUIRect::VSplitMid((CUIRect *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         (CUIRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      iVar3 = DoButton_ButtonDec(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffa8,Checked,(CUIRect *)in_RDI,
                                 (int)((ulong)this >> 0x20),in_stack_ffffffffffffffe0);
      if (iVar3 != 0) {
        *(undefined1 *)&this->m_aClips[1].h = 0;
      }
      iVar3 = DoButton_ButtonInc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffa8,Checked,(CUIRect *)in_RDI,
                                 (int)((ulong)this >> 0x20),in_stack_ffffffffffffffe0);
      if (iVar3 != 0) {
        *(undefined1 *)&this->m_aClips[1].h = 1;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return false;
    }
    CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                       in_stack_ffffffffffffff58,(CUIRect *)0x2161c5);
    CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                       in_stack_ffffffffffffff58,(CUIRect *)0x2161e5);
    in_stack_ffffffffffffff68 = in_RDI;
    in_stack_ffffffffffffff70 =
         (CUIRect *)(PopupSelectConfigAutoMap::s_AutoMapperConfigButtons + (int)fVar6);
    in_RDI = in_stack_ffffffffffffff68;
    ppCVar4 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_stack_ffffffffffffff68->m_Map).m_lImages,(int)this->m_MouseY);
    iVar3 = (*(*ppCVar4)->m_pAutoMapper->_vptr_IAutoMapper[6])
                      ((*ppCVar4)->m_pAutoMapper,(ulong)(uint)fVar6);
    in_stack_ffffffffffffff78 = (CEditor *)CONCAT44(extraout_var,iVar3);
    uVar2 = in_stack_ffffffffffffff84 & 0xffffff;
    if (((uint)this->m_aClips[1].h & 1) != 0) {
      uVar2 = CONCAT13(this->m_aClips[1].w == fVar6,(int3)in_stack_ffffffffffffff84);
    }
    in_stack_ffffffffffffff84 = uVar2;
    in_stack_ffffffffffffff58 = (CUIRect *)0x0;
    iVar3 = DoButton_Editor(in_RDI,this,(char *)CONCAT44(fVar6,fVar5),in_stack_ffffffffffffff84,
                            (CUIRect *)in_stack_ffffffffffffff78,
                            (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            in_stack_ffffffffffffffc0);
    Checked = (int)((ulong)pCVar7 >> 0x20);
    if (iVar3 != 0) {
      this->m_aClips[1].w = fVar6;
      if (((uint)this->m_aClips[1].h & 1) == 0) {
        s_AutoMapProceedOrder = true;
      }
      goto LAB_002162ca;
    }
    fVar5 = (float)((int)fVar6 + 1);
  } while( true );
}

Assistant:

bool CEditor::PopupSelectConfigAutoMap(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayerTiles *pLayer = static_cast<CLayerTiles*>(pEditor->GetSelectedLayer(0));
	CUIRect Button;
	static int s_AutoMapperConfigButtons[IAutoMapper::MAX_RULES];

	for(int i = 0; i < pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper->RuleSetNum(); ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_AutoMapperConfigButtons[i], pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper->GetRuleSetName(i), pLayer->m_LiveAutoMap && pLayer->m_SelectedRuleSet == i, &Button, 0, 0))
		{
			pLayer->m_SelectedRuleSet = i;
			if(!pLayer->m_LiveAutoMap)
				s_AutoMapProceedOrder = true;
			break;
		}
	}

	View.HSplitTop(2.0f, 0, &View);

	static int s_aIds[2] = {0};

	CUIRect Label, Full, Live;
	View.VSplitMid(&Label, &View);
	pEditor->UI()->DoLabel(&Label, "Type", 10.0f, TEXTALIGN_LEFT);

	View.VSplitMid(&Full, &Live);
	if(pEditor->DoButton_ButtonDec(&s_aIds[0], "Full", !pLayer->m_LiveAutoMap, &Full, 0, ""))
	{
		pLayer->m_LiveAutoMap = false;
	}
	if(pEditor->DoButton_ButtonInc(((char *)&s_aIds[0])+1, "Live", pLayer->m_LiveAutoMap, &Live, 0, ""))
	{
		pLayer->m_LiveAutoMap = true;
	}

	return false;
}